

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<int> *values)

{
  byte bVar1;
  int iVar2;
  int64 iVar3;
  byte *pbVar4;
  ulong uVar5;
  LogMessage *other;
  byte *pbVar6;
  uint uVar7;
  int iVar9;
  LogFinisher local_71;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  uint32 uVar8;
  
  pbVar4 = input->buffer_;
  if (pbVar4 < input->buffer_end_) {
    bVar1 = *pbVar4;
    uVar8 = (uint32)bVar1;
    uVar7 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar4 + 1;
      goto LAB_00425e18;
    }
  }
  else {
    uVar8 = 0;
  }
  iVar3 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
  uVar7 = (uint)iVar3;
  if (iVar3 < 0) {
    return false;
  }
LAB_00425e18:
  iVar9 = values->current_size_;
  if (iVar9 == values->total_size_) {
    RepeatedField<int>::Reserve(values,iVar9 + 1);
    iVar9 = values->current_size_;
  }
  values->current_size_ = iVar9 + 1;
  values->rep_->elements[iVar9] = uVar7;
  iVar9 = values->total_size_ - values->current_size_;
  if (iVar9 != 0 && values->current_size_ <= values->total_size_) {
    local_6c = tag & 0xff | 0x80;
    local_70 = tag >> 7;
    iVar9 = iVar9 + 1;
    do {
      if (tag < 0x80) {
        pbVar4 = input->buffer_;
        pbVar6 = input->buffer_end_;
        if (pbVar6 <= pbVar4) {
          return true;
        }
        if (*pbVar4 != tag) {
          return true;
        }
        pbVar4 = pbVar4 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar4 = input->buffer_;
        pbVar6 = input->buffer_end_;
        if ((int)pbVar6 - (int)pbVar4 < 2) {
          return true;
        }
        if (local_6c != *pbVar4) {
          return true;
        }
        if (local_70 != pbVar4[1]) {
          return true;
        }
        pbVar4 = pbVar4 + 2;
      }
      input->buffer_ = pbVar4;
      if (pbVar4 < pbVar6) {
        bVar1 = *pbVar4;
        uVar5 = (ulong)bVar1;
        uVar8 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00425ee5;
        input->buffer_ = pbVar4 + 1;
      }
      else {
        uVar8 = 0;
LAB_00425ee5:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      iVar2 = values->current_size_;
      if (values->total_size_ <= iVar2) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x456);
        other = LogMessage::operator<<(&local_68,"CHECK failed: (current_size_) < (total_size_): ");
        LogFinisher::operator=(&local_71,other);
        LogMessage::~LogMessage(&local_68);
        iVar2 = values->current_size_;
      }
      values->current_size_ = iVar2 + 1;
      values->rep_->elements[iVar2] = (int)uVar5;
      iVar9 = iVar9 + -1;
    } while (1 < iVar9);
  }
  return true;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}